

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int m_gt_0(char *z)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  
  pcVar2 = z + 1;
  do {
    pcVar5 = pcVar2;
    cVar1 = pcVar5[-1];
    lVar6 = (long)cVar1;
    if (lVar6 == 0) {
      iVar3 = 0;
    }
    else if (lVar6 == 0x79) {
      iVar3 = isConsonant(pcVar5);
    }
    else {
      iVar3 = 1 - (char)(&DAT_001dee8f)[lVar6];
    }
    pcVar2 = pcVar5 + 1;
  } while (iVar3 != 0);
  if (cVar1 == '\0') {
    uVar4 = 0;
  }
  else {
    pcVar2 = pcVar5 + -1;
    do {
      pcVar5 = pcVar2;
      iVar3 = isConsonant(pcVar5);
      pcVar2 = pcVar5 + 1;
    } while (iVar3 != 0);
    uVar4 = (uint)(*pcVar5 != '\0');
  }
  return uVar4;
}

Assistant:

static int m_gt_0(const char *z){
  while( isVowel(z) ){ z++; }
  if( *z==0 ) return 0;
  while( isConsonant(z) ){ z++; }
  return *z!=0;
}